

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::PartitionGraph::updateEdgeCost(PartitionGraph *this,size_t edgeId,double delta)

{
  vector<double,_std::allocator<double>_> *this_00;
  iterator __position;
  pointer pdVar1;
  ulong uVar2;
  double local_20;
  value_type_conflict2 local_18;
  
  this_00 = &this->branchingEdgeCosts_;
  __position._M_current =
       (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_20 = delta;
  if (uVar2 == edgeId) {
    if (__position._M_current ==
        (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                ((vector<double,std::allocator<double>> *)this_00,__position,&local_20);
    }
    else {
      *__position._M_current = delta;
      (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    if (uVar2 < edgeId) {
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this_00,edgeId + 1,&local_18);
    }
    pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[edgeId] = local_20 + pdVar1[edgeId];
  }
  return;
}

Assistant:

void updateEdgeCost(size_t edgeId, double delta)
    {
        // NOTE you have to check whether the edge has vanished!
        if (edgeId == branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.emplace_back(delta);
            return;
        } else if (edgeId > branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.resize(edgeId + 1, 0);
        }
        branchingEdgeCosts_[edgeId] += delta;
    }